

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O1

ion_err_t bpptree_find(ion_dictionary_t *dictionary,ion_predicate_t *predicate,
                      ion_dict_cursor_t **cursor)

{
  ion_predicate_type_t iVar1;
  ion_dictionary_parent_t *piVar2;
  ion_boolean_t iVar3;
  ion_bpp_err_t iVar4;
  ion_dict_cursor_t *piVar5;
  void *key;
  ion_predicate_t *__ptr;
  void *pvVar6;
  void *pvVar7;
  ion_err_t iVar8;
  size_t __size;
  
  piVar2 = dictionary->instance;
  __size = (size_t)(piVar2->record).key_size;
  piVar5 = (ion_dict_cursor_t *)malloc(0x38);
  *cursor = piVar5;
  if (piVar5 == (ion_dict_cursor_t *)0x0) {
    return '\x06';
  }
  key = malloc(__size);
  *(void **)(piVar5 + 1) = key;
  if (key == (void *)0x0) {
LAB_00108ed3:
    free(piVar5);
    iVar8 = '\x06';
  }
  else {
    piVar5->dictionary = dictionary;
    piVar5->status = '\x03';
    piVar5->destroy = bpptree_destroy_cursor;
    piVar5->next = bpptree_next;
    __ptr = (ion_predicate_t *)malloc(0x20);
    piVar5->predicate = __ptr;
    if (__ptr == (ion_predicate_t *)0x0) {
LAB_00108ecb:
      free(key);
      goto LAB_00108ed3;
    }
    iVar1 = predicate->type;
    __ptr->type = iVar1;
    __ptr->destroy = predicate->destroy;
    switch(iVar1) {
    case '\0':
      pvVar6 = (predicate->statement).range.lower_bound;
      pvVar7 = malloc(__size);
      (__ptr->statement).range.lower_bound = pvVar7;
      if (pvVar7 == (void *)0x0) goto LAB_00108ec3;
      memcpy(pvVar7,pvVar6,__size);
      memcpy(key,pvVar6,__size);
      iVar4 = b_get(*(ion_bpp_handle_t *)(piVar2 + 1),pvVar6,
                    (ion_bpp_external_address_t *)&piVar5[1].dictionary);
      piVar5 = *cursor;
      if (iVar4 == bErrOk) {
LAB_00108e83:
        piVar5->status = '\x02';
      }
      else {
LAB_00108e05:
        piVar5->status = '\x01';
      }
    case '\x03':
      iVar8 = '\0';
      break;
    case '\x01':
      pvVar6 = malloc(__size);
      (__ptr->statement).range.lower_bound = pvVar6;
      if (pvVar6 != (void *)0x0) {
        memcpy(pvVar6,(predicate->statement).range.lower_bound,__size);
        pvVar7 = malloc(__size);
        (__ptr->statement).range.upper_bound = pvVar7;
        if (pvVar7 != (void *)0x0) {
          memcpy(pvVar7,(predicate->statement).range.upper_bound,__size);
          b_find_first_greater_or_equal
                    (*(ion_bpp_handle_t *)(piVar2 + 1),pvVar6,key,
                     (ion_bpp_external_address_t *)&piVar5[1].dictionary);
          iVar3 = test_predicate(*cursor,*(ion_key_t *)(piVar5 + 1));
          piVar5 = *cursor;
          if (iVar3 != '\0') goto LAB_00108e83;
          goto LAB_00108e05;
        }
        free(pvVar6);
      }
LAB_00108ec3:
      free(__ptr);
      goto LAB_00108ecb;
    case '\x02':
      iVar4 = b_find_first_key(*(ion_bpp_handle_t *)(piVar2 + 1),key,
                               (ion_bpp_external_address_t *)&piVar5[1].dictionary);
      iVar8 = '\0';
      (*cursor)->status = (iVar4 == bErrOk) + '\x01';
      break;
    default:
      iVar8 = '\x05';
    }
  }
  return iVar8;
}

Assistant:

ion_err_t
bpptree_find(
	ion_dictionary_t	*dictionary,
	ion_predicate_t		*predicate,
	ion_dict_cursor_t	**cursor
) {
	ion_bpptree_t	*bpptree	= (ion_bpptree_t *) dictionary->instance;
	ion_key_size_t	key_size	= dictionary->instance->record.key_size;

	*cursor = malloc(sizeof(ion_bpp_cursor_t));

	if (NULL == *cursor) {
		return err_out_of_memory;
	}

	ion_bpp_cursor_t *bCursor = (ion_bpp_cursor_t *) (*cursor);

	bCursor->cur_key = malloc(key_size);

	if (NULL == bCursor->cur_key) {
		free(bCursor);
		return err_out_of_memory;
	}

	(*cursor)->dictionary	= dictionary;
	(*cursor)->status		= cs_cursor_uninitialized;

	(*cursor)->destroy		= bpptree_destroy_cursor;
	(*cursor)->next			= bpptree_next;

	(*cursor)->predicate	= malloc(sizeof(ion_predicate_t));

	if (NULL == (*cursor)->predicate) {
		free(bCursor->cur_key);
		free(*cursor);
		return err_out_of_memory;
	}

	(*cursor)->predicate->type		= predicate->type;
	(*cursor)->predicate->destroy	= predicate->destroy;

	switch (predicate->type) {
		case predicate_equality: {
			ion_key_t target_key = predicate->statement.equality.equality_value;

			(*cursor)->predicate->statement.equality.equality_value = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.equality.equality_value) {
				free((*cursor)->predicate);
				free(bCursor->cur_key);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.equality.equality_value, target_key, key_size);

			memcpy(bCursor->cur_key, target_key, key_size);

			ion_bpp_err_t err = b_get(bpptree->tree, target_key, &bCursor->offset);

			if (bErrOk != err) {
				/* If this happens, that means the target key doesn't exist */
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;
				return err_ok;
			}

			break;
		}

		case predicate_range: {
			(*cursor)->predicate->statement.range.lower_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.lower_bound) {
				free((*cursor)->predicate);
				free(bCursor->cur_key);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.lower_bound, predicate->statement.range.lower_bound, key_size);

			(*cursor)->predicate->statement.range.upper_bound = malloc(key_size);

			if (NULL == (*cursor)->predicate->statement.range.upper_bound) {
				free((*cursor)->predicate->statement.range.lower_bound);
				free((*cursor)->predicate);
				free(bCursor->cur_key);
				free(*cursor);
				return err_out_of_memory;
			}

			memcpy((*cursor)->predicate->statement.range.upper_bound, predicate->statement.range.upper_bound, key_size);

			/* We search for the FGEQ of the Lower bound. */
			b_find_first_greater_or_equal(bpptree->tree, (*cursor)->predicate->statement.range.lower_bound, bCursor->cur_key, &bCursor->offset);

			/* If the key returned doesn't satisfy the predicate, we can exit */
			if (boolean_false == test_predicate(*cursor, bCursor->cur_key)) {
				(*cursor)->status = cs_end_of_results;
				return err_ok;
			}
			else {
				(*cursor)->status = cs_cursor_initialized;
				return err_ok;
			}

			break;
		}

		case predicate_all_records: {
			ion_bpp_err_t err;

			/* We search for first key in B++ tree. */
			err					= b_find_first_key(bpptree->tree, bCursor->cur_key, &bCursor->offset);

			(*cursor)->status	= cs_cursor_initialized;

			if (bErrOk != err) {
				(*cursor)->status = cs_end_of_results;
			}

			return err_ok;
			break;
		}

		case predicate_predicate: {
			break;
		}

		default: {
			return err_invalid_predicate;
			break;
		}
	}

	return err_ok;
}